

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_get_context_info(mg_context *ctx,char *buffer,int buflen)

{
  int buflen_local;
  char *buffer_local;
  mg_context *ctx_local;
  
  if ((buffer != (char *)0x0) && (0 < buflen)) {
    *buffer = '\0';
  }
  return 0;
}

Assistant:

CIVETWEB_API int
mg_get_context_info(const struct mg_context *ctx, char *buffer, int buflen)
{
#if defined(USE_SERVER_STATS)
	char *end, *append_eoobj = NULL, block[256];
	size_t context_info_length = 0;

#if defined(_WIN32)
	static const char eol[] = "\r\n", eoobj[] = "\r\n}\r\n";
#else
	static const char eol[] = "\n", eoobj[] = "\n}\n";
#endif
	struct mg_memory_stat *ms = get_memory_stat((struct mg_context *)ctx);

	if ((buffer == NULL) || (buflen < 1)) {
		buflen = 0;
		end = buffer;
	} else {
		*buffer = 0;
		end = buffer + buflen;
	}
	if (buflen > (int)(sizeof(eoobj) - 1)) {
		/* has enough space to append eoobj */
		append_eoobj = buffer;
		end -= sizeof(eoobj) - 1;
	}

	context_info_length += mg_str_append(&buffer, end, "{");

	if (ms) { /* <-- should be always true */
		      /* Memory information */
		int blockCount = (int)ms->blockCount;
		int64_t totalMemUsed = ms->totalMemUsed;
		int64_t maxMemUsed = ms->maxMemUsed;
		if (totalMemUsed > maxMemUsed) {
			maxMemUsed = totalMemUsed;
		}

		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            "%s\"memory\" : {%s"
		            "\"blocks\" : %i,%s"
		            "\"used\" : %" INT64_FMT ",%s"
		            "\"maxUsed\" : %" INT64_FMT "%s"
		            "}",
		            eol,
		            eol,
		            blockCount,
		            eol,
		            totalMemUsed,
		            eol,
		            maxMemUsed,
		            eol);
		context_info_length += mg_str_append(&buffer, end, block);
	}

	if (ctx) {
		/* Declare all variables at begin of the block, to comply
		 * with old C standards. */
		char start_time_str[64] = {0};
		char now_str[64] = {0};
		time_t start_time = ctx->start_time;
		time_t now = time(NULL);
		int64_t total_data_read, total_data_written;
		int active_connections = (int)ctx->active_connections;
		int max_active_connections = (int)ctx->max_active_connections;
		int total_connections = (int)ctx->total_connections;
		if (active_connections > max_active_connections) {
			max_active_connections = active_connections;
		}
		if (active_connections > total_connections) {
			total_connections = active_connections;
		}

		/* Connections information */
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"connections\" : {%s"
		            "\"active\" : %i,%s"
		            "\"maxActive\" : %i,%s"
		            "\"total\" : %i%s"
		            "}",
		            eol,
		            eol,
		            active_connections,
		            eol,
		            max_active_connections,
		            eol,
		            total_connections,
		            eol);
		context_info_length += mg_str_append(&buffer, end, block);

		/* Queue information */
#if !defined(ALTERNATIVE_QUEUE)
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"queue\" : {%s"
		            "\"length\" : %i,%s"
		            "\"filled\" : %i,%s"
		            "\"maxFilled\" : %i,%s"
		            "\"full\" : %s%s"
		            "}",
		            eol,
		            eol,
		            ctx->sq_size,
		            eol,
		            ctx->sq_head - ctx->sq_tail,
		            eol,
		            ctx->sq_max_fill,
		            eol,
		            (ctx->sq_blocked ? "true" : "false"),
		            eol);
		context_info_length += mg_str_append(&buffer, end, block);
#endif

		/* Requests information */
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"requests\" : {%s"
		            "\"total\" : %lu%s"
		            "}",
		            eol,
		            eol,
		            (unsigned long)ctx->total_requests,
		            eol);
		context_info_length += mg_str_append(&buffer, end, block);

		/* Data information */
		total_data_read =
		    mg_atomic_add64((volatile int64_t *)&ctx->total_data_read, 0);
		total_data_written =
		    mg_atomic_add64((volatile int64_t *)&ctx->total_data_written, 0);
		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"data\" : {%s"
		            "\"read\" : %" INT64_FMT ",%s"
		            "\"written\" : %" INT64_FMT "%s"
		            "}",
		            eol,
		            eol,
		            total_data_read,
		            eol,
		            total_data_written,
		            eol);
		context_info_length += mg_str_append(&buffer, end, block);

		/* Execution time information */
		gmt_time_string(start_time_str,
		                sizeof(start_time_str) - 1,
		                &start_time);
		gmt_time_string(now_str, sizeof(now_str) - 1, &now);

		mg_snprintf(NULL,
		            NULL,
		            block,
		            sizeof(block),
		            ",%s\"time\" : {%s"
		            "\"uptime\" : %.0f,%s"
		            "\"start\" : \"%s\",%s"
		            "\"now\" : \"%s\"%s"
		            "}",
		            eol,
		            eol,
		            difftime(now, start_time),
		            eol,
		            start_time_str,
		            eol,
		            now_str,
		            eol);
		context_info_length += mg_str_append(&buffer, end, block);
	}

	/* Terminate string */
	if (append_eoobj) {
		strcat(append_eoobj, eoobj);
	}
	context_info_length += sizeof(eoobj) - 1;

	return (int)context_info_length;
#else
	(void)ctx;
	if ((buffer != NULL) && (buflen > 0)) {
		*buffer = 0;
	}
	return 0;
#endif
}